

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

void __thiscall libtorrent::aux::peer_list::set_failcount(peer_list *this,torrent_peer *p,int f)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  bVar1 = is_connect_candidate(this,p);
  *(uint *)&p->field_0x1b = *(uint *)&p->field_0x1b & 0xffffffe0 | f & 0x1fU;
  bVar2 = is_connect_candidate(this,p);
  if (bVar1 != bVar2) {
    iVar3 = (-(uint)bVar1 | 1) + this->m_num_connect_candidates;
    iVar4 = 0;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    if (!bVar1) {
      iVar4 = iVar3;
    }
    this->m_num_connect_candidates = iVar4;
  }
  return;
}

Assistant:

void peer_list::set_failcount(torrent_peer* p, int const f)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		TORRENT_ASSERT(p->in_use);
		bool const was_conn_cand = is_connect_candidate(*p);
		p->failcount = aux::numeric_cast<std::uint32_t>(f);
		if (was_conn_cand != is_connect_candidate(*p))
		{
			update_connect_candidates(was_conn_cand ? -1 : 1);
		}
	}